

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2r2rect.cc
# Opt level: O0

S2Cap * __thiscall S2R2Rect::GetCapBound(S2Cap *__return_storage_ptr__,S2R2Rect *this)

{
  bool bVar1;
  R2Point RVar2;
  R2Point local_78;
  S2Point local_68;
  int local_4c;
  undefined1 auStack_48 [4];
  int k;
  S2Point local_38;
  undefined1 local_19;
  S2R2Rect *local_18;
  S2R2Rect *this_local;
  S2Cap *cap;
  
  local_18 = this;
  this_local = (S2R2Rect *)__return_storage_ptr__;
  bVar1 = is_empty(this);
  if (bVar1) {
    S2Cap::Empty();
  }
  else {
    local_19 = 0;
    _auStack_48 = GetCenter(this);
    ToS2Point(&local_38,(R2Point *)auStack_48);
    S2Cap::FromPoint(__return_storage_ptr__,&local_38);
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      RVar2 = GetVertex(this,local_4c);
      local_78 = RVar2;
      ToS2Point(&local_68,&local_78);
      S2Cap::AddPoint(__return_storage_ptr__,&local_68);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2R2Rect::GetCapBound() const {
  if (is_empty()) return S2Cap::Empty();

  // The rectangle is a convex polygon on the sphere, since it is a subset of
  // one cube face.  Its bounding cap is also a convex region on the sphere,
  // and therefore we can bound the rectangle by just bounding its vertices.
  // We use the rectangle's center in (s,t)-space as the cap axis.  This
  // doesn't yield the minimal cap but it's pretty close.
  S2Cap cap = S2Cap::FromPoint(ToS2Point(GetCenter()));
  for (int k = 0; k < 4; ++k) {
    cap.AddPoint(ToS2Point(GetVertex(k)));
  }
  return cap;
}